

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

void Assimp::ZipArchiveIOSystem::Implement::SimplifyFilename(string *filename)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_29;
  
  ReplaceAllChar(filename,'\\','/');
  lVar1 = std::__cxx11::string::find_first_not_of((char *)filename,0x60923b);
  if (lVar1 != 0) {
    std::__cxx11::string::erase((ulong)filename,0);
  }
  if ((SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,"/../",
               &local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_);
  }
  while (uVar3 = std::__cxx11::string::find((string *)filename,0x8328d0),
        uVar3 != 0xffffffffffffffff) {
    uVar4 = std::__cxx11::string::rfind((char)filename,0x2f);
    if (uVar4 == uVar3) {
      uVar4 = 0;
    }
    std::__cxx11::string::erase((ulong)filename,uVar4);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::SimplifyFilename(std::string& filename)
    {
        ReplaceAllChar(filename, '\\', '/');

        // Remove all . and / from the beginning of the path
        size_t pos = filename.find_first_not_of("./");
        if (pos != 0)
            filename.erase(0, pos);

        // Simplify "my/folder/../file.png" constructions, if any
        static const std::string relative("/../");
        const size_t relsize = relative.size() - 1;
        pos = filename.find(relative);
        while (pos != std::string::npos)
        {
            // Previous slash
            size_t prevpos = filename.rfind('/', pos - 1);
            if (prevpos == pos)
                filename.erase(0, pos + relative.size());
            else
                filename.erase(prevpos, pos + relsize - prevpos);

            pos = filename.find(relative);
        }
    }